

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ddstexture.cpp
# Opt level: O2

int __thiscall
FDDSTexture::CopyTrueColorPixels
          (FDDSTexture *this,FBitmap *bmp,int x,int y,int rotate,FCopyInfo *inf)

{
  ushort uVar1;
  uint uVar2;
  BYTE *tcbuf;
  undefined4 in_register_00000084;
  FWadLump lump;
  
  FWadCollection::OpenLumpNum(&lump,&Wads,(this->super_FTexture).SourceLump);
  tcbuf = (BYTE *)operator_new__((ulong)((uint)(this->super_FTexture).Height *
                                         (uint)(this->super_FTexture).Width * 4));
  FWadLump::Seek(&lump,0x80,0);
  if (this->Format - 1 < 4) {
    ReadRGB(this,&lump,tcbuf);
  }
  else {
    uVar2 = this->Format + 0xceaba7bc;
    uVar2 = uVar2 * 0x100 | uVar2 >> 0x18;
    if (uVar2 - 1 < 2) {
      DecompressDXT3(this,&lump,false,tcbuf);
    }
    else if (uVar2 - 3 < 2) {
      DecompressDXT5(this,&lump,false,tcbuf);
    }
    else if (uVar2 == 0) {
      DecompressDXT1(this,&lump,tcbuf);
    }
  }
  uVar1 = (this->super_FTexture).Width;
  (*bmp->_vptr_FBitmap[2])
            (bmp,(ulong)(uint)x,(ulong)(uint)y,tcbuf,(ulong)uVar1,
             (ulong)(this->super_FTexture).Height,4,(ulong)((uint)uVar1 * 4),
             CONCAT44(in_register_00000084,rotate),2,inf,0,0,0);
  operator_delete__(tcbuf);
  FWadLump::~FWadLump(&lump);
  return -1;
}

Assistant:

int FDDSTexture::CopyTrueColorPixels(FBitmap *bmp, int x, int y, int rotate, FCopyInfo *inf)
{
	FWadLump lump = Wads.OpenLumpNum (SourceLump);

	BYTE *TexBuffer = new BYTE[4*Width*Height];

	lump.Seek (sizeof(DDSURFACEDESC2) + 4, SEEK_SET);

	if (Format >= 1 && Format <= 4)		// RGB: Format is # of bytes per pixel
	{
		ReadRGB (lump, TexBuffer);
	}
	else if (Format == ID_DXT1)
	{
		DecompressDXT1 (lump, TexBuffer);
	}
	else if (Format == ID_DXT3 || Format == ID_DXT2)
	{
		DecompressDXT3 (lump, Format == ID_DXT2, TexBuffer);
	}
	else if (Format == ID_DXT5 || Format == ID_DXT4)
	{
		DecompressDXT5 (lump, Format == ID_DXT4, TexBuffer);
	}

	// All formats decompress to RGBA.
	bmp->CopyPixelDataRGB(x, y, TexBuffer, Width, Height, 4, Width*4, rotate, CF_RGBA, inf);
	delete [] TexBuffer;
	return -1;
}